

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg_Data.h
# Opt level: O2

void __thiscall Nova::Arg_Data::Print_Synopsis(Arg_Data *this)

{
  Type TVar1;
  ostream *poVar2;
  char *pcVar3;
  
  TVar1 = this->type;
  poVar2 = std::operator<<(Log::(anonymous_namespace)::cerr,"[");
  poVar2 = std::operator<<(poVar2,(string *)&this->str);
  if (TVar1 == OPTION) {
    pcVar3 = "]";
  }
  else {
    poVar2 = std::operator<<(poVar2," <");
    poVar2 = std::operator<<(poVar2,(string *)&this->val_name);
    pcVar3 = ">]";
  }
  std::operator<<(poVar2,pcVar3);
  return;
}

Assistant:

void Print_Synopsis() const
    {
        if(type==OPTION) Log::cerr<<"["<<str<<"]";
        else Log::cerr<<"["<<str<<" <"<<val_name<<">]";
    }